

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O1

void skiwi::string_length(asmcode *code,operand string_reg)

{
  skiwi *this;
  uint64_t in_RDX;
  string stringlengthdone;
  operand local_44;
  operation local_40 [3];
  operand local_34;
  operand local_30 [2];
  string local_28;
  
  this = label;
  label = label + 1;
  local_30[0] = string_reg;
  label_to_string_abi_cxx11_(&local_28,this,in_RDX);
  local_40[0] = 0x40;
  local_44 = R15;
  local_34 = get_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_44 = ST6;
  local_34 = R11;
  local_30[1] = 0x39;
  local_40[0] = ~ADD;
  local_40[1] = 0xffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,&local_44,&local_34,local_30 + 1,(long *)local_40);
  local_40[0] = AND;
  local_44 = R15;
  local_34 = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = SHL;
  local_44 = R15;
  local_34 = NUMBER;
  local_30[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = ADD;
  local_44 = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand&,assembler::asmcode::operand>
            (code,local_40,local_30,&local_44);
  local_40[0] = SUB;
  local_44 = R15;
  local_34 = NUMBER;
  local_30[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = MOV;
  local_44 = AL;
  local_34 = get_byte_mem_operand(local_30[0]);
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_40,&local_44,&local_34);
  local_40[0] = CMP;
  local_44 = AL;
  local_34 = NUMBER;
  local_30[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,&local_34,(int *)(local_30 + 1));
  local_40[0] = JES;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  local_40[0] = INC;
  local_44 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = INC;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand&>
            (code,local_40,local_30);
  local_40[0] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void string_length(asmcode& code, asmcode::operand string_reg)
  {
  /*
  input points to a scheme string (thus not char* or const char*, see string_length_raw)
  clobbers rax, r11, r15, and string_reg
  result is in r15
  string_reg points to the string
  */
  std::string stringlengthdone = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R15, get_mem_operand(string_reg));
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::R15, asmcode::R11);
  code.add(asmcode::SHL, asmcode::R15, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, string_reg, asmcode::R15);
  code.add(asmcode::SUB, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::MOV, asmcode::AL, get_byte_mem_operand(string_reg));
  code.add(asmcode::CMP, asmcode::AL, asmcode::NUMBER, 0);
  code.add(asmcode::JES, stringlengthdone);
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::INC, string_reg);

  code.add(asmcode::LABEL, stringlengthdone);
  // r15 now contains the string length
  }